

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)18>_> * __thiscall
vkt::tessellation::GraphicsPipelineBuilder::build
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,
          GraphicsPipelineBuilder *this,DeviceInterface *vk,VkDevice device,
          VkPipelineLayout pipelineLayout,VkRenderPass renderPass)

{
  int iVar1;
  deUint32 width;
  VkVertexInputAttributeDescription *device_00;
  bool bVar2;
  size_type sVar3;
  int *piVar4;
  deUint32 *pdVar5;
  bool bVar6;
  VkPipelineColorBlendStateCreateInfo *local_408;
  VkPipelineDepthStencilStateCreateInfo *local_3f8;
  VkPipelineMultisampleStateCreateInfo *local_3e8;
  VkPipelineRasterizationStateCreateInfo *local_3d8;
  VkPipelineTessellationStateCreateInfo *local_3c8;
  VkPipelineInputAssemblyStateCreateInfo *local_3b8;
  reference local_3a8;
  undefined1 *local_398;
  VkExtent2D *local_388;
  bool local_36d;
  VkPipelineCache local_350;
  undefined1 local_348 [8];
  VkGraphicsPipelineCreateInfo graphicsPipelineInfo;
  VkPipelineDynamicStateCreateInfo pipelineDynamicStateInfo;
  float local_284;
  undefined1 local_280 [8];
  vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> dynamicStates;
  VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkColorComponentFlags colorComponentsAll;
  VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo;
  deUint32 dStack_198;
  VkStencilOpState stencilOpState;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo;
  undefined1 local_108 [7];
  bool isRasterizationDisabled;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  VkOffset2D VStack_d0;
  bool haveRenderSize;
  VkRect2D scissor;
  VkViewport viewport;
  VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  undefined1 local_68 [4];
  VkPrimitiveTopology topology;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkDevice device_local;
  DeviceInterface *vk_local;
  GraphicsPipelineBuilder *this_local;
  VkRenderPass renderPass_local;
  VkPipelineLayout pipelineLayout_local;
  
  local_68 = (undefined1  [4])0x13;
  vertexInputStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexInputStateInfo._4_4_ = 0;
  vertexInputStateInfo.pNext._0_4_ = 0;
  vertexInputStateInfo.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)device;
  sVar3 = std::
          vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
          ::size(&this->m_vertexInputBindings);
  vertexInputStateInfo.pNext._4_4_ = (undefined4)sVar3;
  vertexInputStateInfo._16_8_ =
       dataPointer<vk::VkVertexInputBindingDescription>(&this->m_vertexInputBindings);
  sVar3 = std::
          vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
          ::size(&this->m_vertexInputAttributes);
  vertexInputStateInfo.pVertexBindingDescriptions._0_4_ = (undefined4)sVar3;
  vertexInputStateInfo._32_8_ =
       dataPointer<vk::VkVertexInputAttributeDescription>(&this->m_vertexInputAttributes);
  memset(&pipelineTessellationStateInfo.flags,0,0x20);
  pipelineTessellationStateInfo.flags = 0x14;
  viewport.minDepth = 2.94273e-44;
  pipelineTessellationStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineTessellationStateInfo._4_4_ = 0;
  pipelineTessellationStateInfo.pNext._0_4_ = 0;
  pipelineTessellationStateInfo.pNext._4_4_ = this->m_patchControlPoints;
  piVar4 = tcu::Vector<int,_2>::x(&this->m_renderSize);
  iVar1 = *piVar4;
  piVar4 = tcu::Vector<int,_2>::y(&this->m_renderSize);
  ::vk::makeViewport((VkViewport *)&scissor.extent,0.0,0.0,(float)iVar1,(float)*piVar4,0.0,1.0);
  VStack_d0 = ::vk::makeOffset2D(0,0);
  pdVar5 = (deUint32 *)tcu::Vector<int,_2>::x(&this->m_renderSize);
  width = *pdVar5;
  pdVar5 = (deUint32 *)tcu::Vector<int,_2>::y(&this->m_renderSize);
  scissor.offset = (VkOffset2D)::vk::makeExtent2D(width,*pdVar5);
  piVar4 = tcu::Vector<int,_2>::x(&this->m_renderSize);
  local_36d = false;
  if (0 < *piVar4) {
    piVar4 = tcu::Vector<int,_2>::y(&this->m_renderSize);
    local_36d = 0 < *piVar4;
  }
  pipelineViewportStateInfo.pScissors._7_1_ = local_36d;
  local_108._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  pipelineViewportStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineViewportStateInfo._4_4_ = 0;
  pipelineViewportStateInfo.pNext._0_4_ = 0;
  pipelineViewportStateInfo.pNext._4_4_ = 1;
  if (local_36d == false) {
    local_388 = (VkExtent2D *)0x0;
  }
  else {
    local_388 = &scissor.extent;
  }
  pipelineViewportStateInfo._16_8_ = local_388;
  pipelineViewportStateInfo.pViewports._0_4_ = 1;
  if (local_36d == false) {
    local_398 = (undefined1 *)0x0;
  }
  else {
    local_398 = (undefined1 *)&stack0xffffffffffffff30;
  }
  pipelineViewportStateInfo._32_8_ = local_398;
  bVar6 = (this->m_shaderStageFlags & 0x10) != 0;
  pipelineMultisampleStateInfo.alphaToCoverageEnable = 0x17;
  memset(&stencilOpState.writeMask,0,0x30);
  stencilOpState.writeMask = 0x18;
  pipelineMultisampleStateInfo.pNext._4_4_ = 1;
  ::vk::makeStencilOpState
            ((VkStencilOpState *)&pipelineDepthStencilStateInfo.maxDepthBounds,VK_STENCIL_OP_KEEP,
             VK_STENCIL_OP_KEEP,VK_STENCIL_OP_KEEP,VK_COMPARE_OP_NEVER,0,0,0);
  pipelineColorBlendAttachmentState.colorWriteMask = 0x19;
  pipelineDepthStencilStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineDepthStencilStateInfo._4_4_ = 0;
  pipelineDepthStencilStateInfo.pNext._0_4_ = 0;
  pipelineDepthStencilStateInfo.pNext._4_4_ = 0;
  pipelineDepthStencilStateInfo.flags = 0;
  pipelineDepthStencilStateInfo.depthTestEnable = 1;
  pipelineDepthStencilStateInfo.depthWriteEnable = 0;
  pipelineDepthStencilStateInfo.depthCompareOp = VK_COMPARE_OP_NEVER;
  pipelineDepthStencilStateInfo.depthBoundsTestEnable =
       (VkBool32)pipelineDepthStencilStateInfo.maxDepthBounds;
  pipelineDepthStencilStateInfo.stencilTestEnable = dStack_198;
  pipelineDepthStencilStateInfo.front.failOp = stencilOpState.failOp;
  pipelineDepthStencilStateInfo.front.passOp = stencilOpState.passOp;
  pipelineDepthStencilStateInfo.front.depthFailOp = stencilOpState.depthFailOp;
  pipelineDepthStencilStateInfo.front.compareOp = stencilOpState.compareOp;
  pipelineDepthStencilStateInfo.front.compareMask = stencilOpState.compareMask;
  pipelineDepthStencilStateInfo.front.writeMask =
       (deUint32)pipelineDepthStencilStateInfo.maxDepthBounds;
  pipelineDepthStencilStateInfo.front.reference = dStack_198;
  pipelineDepthStencilStateInfo.back.failOp = stencilOpState.failOp;
  pipelineDepthStencilStateInfo.back.passOp = stencilOpState.passOp;
  pipelineDepthStencilStateInfo.back.depthFailOp = stencilOpState.depthFailOp;
  pipelineDepthStencilStateInfo.back.compareOp = stencilOpState.compareOp;
  pipelineDepthStencilStateInfo.back.compareMask = stencilOpState.compareMask;
  pipelineDepthStencilStateInfo.back.writeMask = 0;
  pipelineDepthStencilStateInfo.back.reference = 0x3f800000;
  pipelineColorBlendAttachmentState.alphaBlendOp = 0xf;
  pipelineColorBlendStateInfo.blendConstants[3] = (float)(uint)(this->m_blendEnable & 1);
  pipelineColorBlendAttachmentState.blendEnable = 1;
  pipelineColorBlendAttachmentState.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.dstColorBlendFactor = VK_BLEND_FACTOR_SRC_ALPHA;
  pipelineColorBlendAttachmentState.colorBlendOp = VK_BLEND_OP_SUBTRACT;
  pipelineColorBlendAttachmentState.srcAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.dstAlphaBlendFactor = VK_BLEND_FACTOR_SRC1_COLOR;
  dynamicStates.super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0x1a;
  pipelineColorBlendStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineColorBlendStateInfo._4_4_ = 0;
  pipelineColorBlendStateInfo.pNext._0_4_ = 0;
  pipelineColorBlendStateInfo.pNext._4_4_ = 0;
  pipelineColorBlendStateInfo.flags = 3;
  pipelineColorBlendStateInfo.logicOpEnable = 1;
  pipelineColorBlendStateInfo._24_8_ = pipelineColorBlendStateInfo.blendConstants + 3;
  pipelineColorBlendStateInfo.pAttachments._0_4_ = 0;
  pipelineColorBlendStateInfo.pAttachments._4_4_ = 0;
  pipelineColorBlendStateInfo.blendConstants[0] = 0.0;
  pipelineColorBlendStateInfo.blendConstants[1] = 0.0;
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::vector
            ((vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)local_280);
  if ((pipelineViewportStateInfo.pScissors._7_1_ & 1) == 0) {
    local_284 = 0.0;
    std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::push_back
              ((vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)local_280,
               (value_type *)&local_284);
    pipelineDynamicStateInfo.pDynamicStates._0_4_ = 1;
    std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::push_back
              ((vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)local_280,
               (value_type *)&pipelineDynamicStateInfo.pDynamicStates);
  }
  graphicsPipelineInfo.basePipelineIndex = 0x1b;
  pipelineDynamicStateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineDynamicStateInfo._4_4_ = 0;
  pipelineDynamicStateInfo.pNext._0_4_ = 0;
  sVar3 = std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::size
                    ((vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)local_280);
  pipelineDynamicStateInfo.pNext._4_4_ = (undefined4)sVar3;
  bVar2 = std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::empty
                    ((vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)local_280);
  if (bVar2) {
    local_3a8 = (reference)0x0;
  }
  else {
    local_3a8 = std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::operator[]
                          ((vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)
                           local_280,0);
  }
  pipelineDynamicStateInfo._16_8_ = local_3a8;
  local_348._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  graphicsPipelineInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  graphicsPipelineInfo._4_4_ = 0;
  graphicsPipelineInfo.pNext._0_4_ = 0;
  sVar3 = std::
          vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
          ::size(&this->m_shaderStages);
  graphicsPipelineInfo.pNext._4_4_ = (undefined4)sVar3;
  graphicsPipelineInfo._16_8_ =
       std::
       vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
       ::operator[](&this->m_shaderStages,0);
  graphicsPipelineInfo.pStages = (VkPipelineShaderStageCreateInfo *)local_68;
  graphicsPipelineInfo.pVertexInputState =
       (VkPipelineVertexInputStateCreateInfo *)&pipelineTessellationStateInfo.flags;
  if ((this->m_shaderStageFlags & 2) == 0) {
    local_3b8 = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  }
  else {
    local_3b8 = (VkPipelineInputAssemblyStateCreateInfo *)&viewport.minDepth;
  }
  graphicsPipelineInfo.pInputAssemblyState = local_3b8;
  if (bVar6) {
    local_3c8 = (VkPipelineTessellationStateCreateInfo *)local_108;
  }
  else {
    local_3c8 = (VkPipelineTessellationStateCreateInfo *)0x0;
  }
  graphicsPipelineInfo.pTessellationState = local_3c8;
  graphicsPipelineInfo.pViewportState =
       (VkPipelineViewportStateCreateInfo *)&pipelineMultisampleStateInfo.alphaToCoverageEnable;
  if (bVar6) {
    local_3d8 = (VkPipelineRasterizationStateCreateInfo *)&stencilOpState.writeMask;
  }
  else {
    local_3d8 = (VkPipelineRasterizationStateCreateInfo *)0x0;
  }
  graphicsPipelineInfo.pRasterizationState = local_3d8;
  if (bVar6) {
    local_3e8 = (VkPipelineMultisampleStateCreateInfo *)
                &pipelineColorBlendAttachmentState.colorWriteMask;
  }
  else {
    local_3e8 = (VkPipelineMultisampleStateCreateInfo *)0x0;
  }
  graphicsPipelineInfo.pMultisampleState = local_3e8;
  if (bVar6) {
    local_3f8 = (VkPipelineDepthStencilStateCreateInfo *)
                &dynamicStates.
                 super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    local_3f8 = (VkPipelineDepthStencilStateCreateInfo *)0x0;
  }
  graphicsPipelineInfo.pDepthStencilState = local_3f8;
  bVar6 = std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::empty
                    ((vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)local_280);
  if (bVar6) {
    local_408 = (VkPipelineColorBlendStateCreateInfo *)0x0;
  }
  else {
    local_408 = (VkPipelineColorBlendStateCreateInfo *)&graphicsPipelineInfo.basePipelineIndex;
  }
  graphicsPipelineInfo.pColorBlendState = local_408;
  graphicsPipelineInfo.renderPass.m_internal._0_4_ = 0;
  graphicsPipelineInfo.pDynamicState = (VkPipelineDynamicStateCreateInfo *)pipelineLayout.m_internal
  ;
  graphicsPipelineInfo.layout.m_internal = renderPass.m_internal;
  ::vk::Handle<(vk::HandleType)18>::Handle
            ((Handle<(vk::HandleType)18> *)&graphicsPipelineInfo.subpass,0);
  device_00 = vertexInputStateInfo.pVertexAttributeDescriptions;
  graphicsPipelineInfo.basePipelineHandle.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_350,0);
  ::vk::createGraphicsPipeline
            (__return_storage_ptr__,vk,(VkDevice)device_00,local_350,
             (VkGraphicsPipelineCreateInfo *)local_348,(VkAllocationCallbacks *)0x0);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::~vector
            ((vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)local_280);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> GraphicsPipelineBuilder::build (const DeviceInterface&	vk,
												 const VkDevice			device,
												 const VkPipelineLayout	pipelineLayout,
												 const VkRenderPass		renderPass)
{
	const VkPipelineVertexInputStateCreateInfo vertexInputStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineVertexInputStateCreateFlags)0,						// VkPipelineVertexInputStateCreateFlags       flags;
		static_cast<deUint32>(m_vertexInputBindings.size()),			// uint32_t                                    vertexBindingDescriptionCount;
		dataPointer(m_vertexInputBindings),								// const VkVertexInputBindingDescription*      pVertexBindingDescriptions;
		static_cast<deUint32>(m_vertexInputAttributes.size()),			// uint32_t                                    vertexAttributeDescriptionCount;
		dataPointer(m_vertexInputAttributes),							// const VkVertexInputAttributeDescription*    pVertexAttributeDescriptions;
	};

	const VkPrimitiveTopology topology = (m_shaderStageFlags & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) ? VK_PRIMITIVE_TOPOLOGY_PATCH_LIST
																										 : m_primitiveTopology;
	const VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineInputAssemblyStateCreateFlags)0,						// VkPipelineInputAssemblyStateCreateFlags     flags;
		topology,														// VkPrimitiveTopology                         topology;
		VK_FALSE,														// VkBool32                                    primitiveRestartEnable;
	};

	const VkPipelineTessellationStateCreateInfo pipelineTessellationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineTessellationStateCreateFlags)0,						// VkPipelineTessellationStateCreateFlags      flags;
		m_patchControlPoints,											// uint32_t                                    patchControlPoints;
	};

	const VkViewport viewport = makeViewport(
		0.0f, 0.0f,
		static_cast<float>(m_renderSize.x()), static_cast<float>(m_renderSize.y()),
		0.0f, 1.0f);

	const VkRect2D scissor = {
		makeOffset2D(0, 0),
		makeExtent2D(m_renderSize.x(), m_renderSize.y()),
	};

	const bool haveRenderSize = m_renderSize.x() > 0 && m_renderSize.y() > 0;

	const VkPipelineViewportStateCreateInfo pipelineViewportStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,	// VkStructureType                             sType;
		DE_NULL,												// const void*                                 pNext;
		(VkPipelineViewportStateCreateFlags)0,					// VkPipelineViewportStateCreateFlags          flags;
		1u,														// uint32_t                                    viewportCount;
		haveRenderSize ? &viewport : DE_NULL,					// const VkViewport*                           pViewports;
		1u,														// uint32_t                                    scissorCount;
		haveRenderSize ? &scissor : DE_NULL,					// const VkRect2D*                             pScissors;
	};

	const bool isRasterizationDisabled = ((m_shaderStageFlags & VK_SHADER_STAGE_FRAGMENT_BIT) == 0);
	const VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,		// VkStructureType                          sType;
		DE_NULL,														// const void*                              pNext;
		(VkPipelineRasterizationStateCreateFlags)0,						// VkPipelineRasterizationStateCreateFlags  flags;
		VK_FALSE,														// VkBool32                                 depthClampEnable;
		isRasterizationDisabled,										// VkBool32                                 rasterizerDiscardEnable;
		VK_POLYGON_MODE_FILL,											// VkPolygonMode							polygonMode;
		m_cullModeFlags,												// VkCullModeFlags							cullMode;
		m_frontFace,													// VkFrontFace								frontFace;
		VK_FALSE,														// VkBool32									depthBiasEnable;
		0.0f,															// float									depthBiasConstantFactor;
		0.0f,															// float									depthBiasClamp;
		0.0f,															// float									depthBiasSlopeFactor;
		1.0f,															// float									lineWidth;
	};

	const VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineMultisampleStateCreateFlags)0,					// VkPipelineMultisampleStateCreateFlags	flags;
		VK_SAMPLE_COUNT_1_BIT,										// VkSampleCountFlagBits					rasterizationSamples;
		VK_FALSE,													// VkBool32									sampleShadingEnable;
		0.0f,														// float									minSampleShading;
		DE_NULL,													// const VkSampleMask*						pSampleMask;
		VK_FALSE,													// VkBool32									alphaToCoverageEnable;
		VK_FALSE													// VkBool32									alphaToOneEnable;
	};

	const VkStencilOpState stencilOpState = makeStencilOpState(
		VK_STENCIL_OP_KEEP,		// stencil fail
		VK_STENCIL_OP_KEEP,		// depth & stencil pass
		VK_STENCIL_OP_KEEP,		// depth only fail
		VK_COMPARE_OP_NEVER,	// compare op
		0u,						// compare mask
		0u,						// write mask
		0u);					// reference

	const VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineDepthStencilStateCreateFlags)0,					// VkPipelineDepthStencilStateCreateFlags	flags;
		VK_FALSE,													// VkBool32									depthTestEnable;
		VK_FALSE,													// VkBool32									depthWriteEnable;
		VK_COMPARE_OP_LESS,											// VkCompareOp								depthCompareOp;
		VK_FALSE,													// VkBool32									depthBoundsTestEnable;
		VK_FALSE,													// VkBool32									stencilTestEnable;
		stencilOpState,												// VkStencilOpState							front;
		stencilOpState,												// VkStencilOpState							back;
		0.0f,														// float									minDepthBounds;
		1.0f,														// float									maxDepthBounds;
	};

	const VkColorComponentFlags colorComponentsAll = VK_COLOR_COMPONENT_R_BIT | VK_COLOR_COMPONENT_G_BIT | VK_COLOR_COMPONENT_B_BIT | VK_COLOR_COMPONENT_A_BIT;
	const VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState =
	{
		m_blendEnable,						// VkBool32					blendEnable;
		VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcColorBlendFactor;
		VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstColorBlendFactor;
		VK_BLEND_OP_ADD,					// VkBlendOp				colorBlendOp;
		VK_BLEND_FACTOR_SRC_ALPHA,			// VkBlendFactor			srcAlphaBlendFactor;
		VK_BLEND_FACTOR_ONE,				// VkBlendFactor			dstAlphaBlendFactor;
		VK_BLEND_OP_ADD,					// VkBlendOp				alphaBlendOp;
		colorComponentsAll,					// VkColorComponentFlags	colorWriteMask;
	};

	const VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,	// VkStructureType								sType;
		DE_NULL,													// const void*									pNext;
		(VkPipelineColorBlendStateCreateFlags)0,					// VkPipelineColorBlendStateCreateFlags			flags;
		VK_FALSE,													// VkBool32										logicOpEnable;
		VK_LOGIC_OP_COPY,											// VkLogicOp									logicOp;
		1u,															// deUint32										attachmentCount;
		&pipelineColorBlendAttachmentState,							// const VkPipelineColorBlendAttachmentState*	pAttachments;
		{ 0.0f, 0.0f, 0.0f, 0.0f },									// float										blendConstants[4];
	};

	std::vector<VkDynamicState> dynamicStates;
	if (!haveRenderSize)
	{
		dynamicStates.push_back(VK_DYNAMIC_STATE_VIEWPORT);
		dynamicStates.push_back(VK_DYNAMIC_STATE_SCISSOR);
	}

	const VkPipelineDynamicStateCreateInfo pipelineDynamicStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO,	// VkStructureType						sType;
		DE_NULL,												// const void*							pNext;
		0,														// VkPipelineDynamicStateCreateFlags	flags;
		static_cast<deUint32>(dynamicStates.size()),			// uint32_t								dynamicStateCount;
		(dynamicStates.empty() ? DE_NULL : &dynamicStates[0]),	// const VkDynamicState*				pDynamicStates;
	};

	const VkGraphicsPipelineCreateInfo graphicsPipelineInfo =
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,						// VkStructureType									sType;
		DE_NULL,																// const void*										pNext;
		(VkPipelineCreateFlags)0,												// VkPipelineCreateFlags							flags;
		static_cast<deUint32>(m_shaderStages.size()),							// deUint32											stageCount;
		&m_shaderStages[0],														// const VkPipelineShaderStageCreateInfo*			pStages;
		&vertexInputStateInfo,													// const VkPipelineVertexInputStateCreateInfo*		pVertexInputState;
		&pipelineInputAssemblyStateInfo,										// const VkPipelineInputAssemblyStateCreateInfo*	pInputAssemblyState;
		(m_shaderStageFlags & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT ? &pipelineTessellationStateInfo : DE_NULL), // const VkPipelineTessellationStateCreateInfo*		pTessellationState;
		(isRasterizationDisabled ? DE_NULL : &pipelineViewportStateInfo),		// const VkPipelineViewportStateCreateInfo*			pViewportState;
		&pipelineRasterizationStateInfo,										// const VkPipelineRasterizationStateCreateInfo*	pRasterizationState;
		(isRasterizationDisabled ? DE_NULL : &pipelineMultisampleStateInfo),	// const VkPipelineMultisampleStateCreateInfo*		pMultisampleState;
		(isRasterizationDisabled ? DE_NULL : &pipelineDepthStencilStateInfo),	// const VkPipelineDepthStencilStateCreateInfo*		pDepthStencilState;
		(isRasterizationDisabled ? DE_NULL : &pipelineColorBlendStateInfo),		// const VkPipelineColorBlendStateCreateInfo*		pColorBlendState;
		(dynamicStates.empty() ? DE_NULL : &pipelineDynamicStateInfo),			// const VkPipelineDynamicStateCreateInfo*			pDynamicState;
		pipelineLayout,															// VkPipelineLayout									layout;
		renderPass,																// VkRenderPass										renderPass;
		0u,																		// deUint32											subpass;
		DE_NULL,																// VkPipeline										basePipelineHandle;
		0,																		// deInt32											basePipelineIndex;
	};

	return createGraphicsPipeline(vk, device, DE_NULL, &graphicsPipelineInfo);
}